

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

bool cppwinrt::has_factory_members(writer *w,TypeDef *type)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  TypeDef *in_RCX;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  local_50;
  
  get_factories_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
              *)&local_50,(cppwinrt *)w,(writer *)type,in_RCX);
  p_Var1 = &local_50._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    bVar2 = false;
  }
  else {
    p_Var3 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    while (*(long *)(p_Var3 + 2) != 0) {
      winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::MethodDef>
                (&local_70,(row_base<winmd::reader::TypeDef> *)(p_Var3 + 2),5);
      bVar2 = local_70.first.super_row_base<winmd::reader::MethodDef>.m_index !=
              local_70.second.super_row_base<winmd::reader::MethodDef>.m_index ||
              local_70.first.super_row_base<winmd::reader::MethodDef>.m_table !=
              local_70.second.super_row_base<winmd::reader::MethodDef>.m_table;
      if ((bVar2) ||
         (p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3), (_Rb_tree_header *)p_Var3 == p_Var1))
      goto LAB_0013bc0f;
    }
    bVar2 = true;
  }
LAB_0013bc0f:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  ::~_Rb_tree(&local_50);
  return bVar2;
}

Assistant:

static bool has_factory_members(writer& w, TypeDef const& type)
    {
        for (auto&&[factory_name, factory] : get_factories(w, type))
        {
            if (!factory.type || !empty(factory.type.MethodList()))
            {
                return true;
            }
        }

        return false;
    }